

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_const_impl.h
# Opt level: O2

void secp256k1_ecmult_const(secp256k1_gej *r,secp256k1_ge *a,secp256k1_scalar *q)

{
  secp256k1_fe *a_00;
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  undefined8 uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  secp256k1_gej *in_R8;
  char *pcVar8;
  secp256k1_ge *psVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  uint negative;
  secp256k1_scalar v2;
  secp256k1_scalar v1;
  secp256k1_ge *local_468;
  secp256k1_ge *local_460;
  ulong local_458;
  secp256k1_scalar s;
  secp256k1_ge t;
  secp256k1_fe neg_y;
  secp256k1_fe global_z;
  secp256k1_ge pre_a_lam [4];
  secp256k1_ge pre_a [4];
  
  iVar1 = secp256k1_ge_is_infinity(a);
  if (iVar1 != 0) {
    secp256k1_gej_set_infinity(r);
    return;
  }
  secp256k1_scalar_add(&s,q,&secp256k1_ecmult_const_K);
  secp256k1_scalar_half(&s,&s);
  secp256k1_scalar_split_lambda(&v1,&v2,&s);
  secp256k1_scalar_add(&v1,&v1,&secp256k1_ecmult_const::S_OFFSET);
  secp256k1_scalar_add(&v2,&v2,&secp256k1_ecmult_const::S_OFFSET);
  uVar7 = 0x81;
  while (uVar7 != 0x100) {
    uVar2 = secp256k1_scalar_get_bits_limb32(&v1,uVar7,1);
    if (uVar2 != 0) {
      pcVar8 = "test condition failed: secp256k1_scalar_get_bits_limb32(&v1, i, 1) == 0";
      uVar4 = 0xd9;
      goto LAB_001143ea;
    }
    uVar2 = secp256k1_scalar_get_bits_limb32(&v2,uVar7,1);
    uVar7 = uVar7 + 1;
    if (uVar2 != 0) goto code_r0x00114054;
  }
  secp256k1_gej_set_ge(r,a);
  secp256k1_ecmult_odd_multiples_table((int)pre_a,pre_a_lam,&global_z,&r->x,in_R8);
  local_468 = pre_a_lam;
  local_460 = pre_a;
  secp256k1_ge_table_set_globalz(4,pre_a,&pre_a_lam[0].x);
  for (lVar6 = 0; lVar6 != 0x1a0; lVar6 = lVar6 + 0x68) {
    secp256k1_ge_mul_lambda
              ((secp256k1_ge *)((long)pre_a_lam[0].x.n + lVar6),
               (secp256k1_ge *)((long)pre_a[0].x.n + lVar6));
  }
  a_00 = &t.y;
  local_460 = (secp256k1_ge *)&local_460[1].y;
  local_468 = (secp256k1_ge *)&local_468[1].y;
  uVar11 = 0x2a;
  while( true ) {
    if ((int)uVar11 < 0) {
      secp256k1_fe_mul(&r->z,&r->z,&global_z);
      return;
    }
    uVar7 = (int)uVar11 * 3;
    uVar2 = secp256k1_scalar_get_bits_var(&v1,uVar7,3);
    uVar3 = secp256k1_scalar_get_bits_var(&v2,uVar7,3);
    uVar7 = uVar2 >> 2 ^ 1;
    if (7 < uVar2) break;
    t.x.n[4] = pre_a[0].x.n[4];
    t.x.magnitude = pre_a[0].x.magnitude;
    t.x.normalized = pre_a[0].x.normalized;
    t.x.n[2] = pre_a[0].x.n[2];
    t.x.n[3] = pre_a[0].x.n[3];
    t.x.n[0] = pre_a[0].x.n[0];
    t.x.n[1] = pre_a[0].x.n[1];
    t.y.n[4] = pre_a[0].y.n[4];
    t.y.magnitude = pre_a[0].y.magnitude;
    t.y.normalized = pre_a[0].y.normalized;
    t.y.n[2] = pre_a[0].y.n[2];
    t.y.n[3] = pre_a[0].y.n[3];
    t.y.n[0] = pre_a[0].y.n[0];
    t.y.n[1] = pre_a[0].y.n[1];
    psVar9 = local_460;
    local_458 = uVar11;
    for (uVar10 = 1; uVar10 != 4; uVar10 = uVar10 + 1) {
      uVar5 = (uint)(((uVar2 ^ -uVar7) & 3) == uVar10);
      secp256k1_fe_cmov(&t.x,(secp256k1_fe *)((long)psVar9 + -0x30),uVar5);
      secp256k1_fe_cmov(a_00,&psVar9->x,uVar5);
      psVar9 = (secp256k1_ge *)(((secp256k1_fe *)((long)psVar9 + 0x60))->n + 1);
    }
    t.infinity = 0;
    secp256k1_fe_negate_unchecked(&neg_y,a_00,1);
    secp256k1_fe_cmov(a_00,&neg_y,uVar7);
    if ((int)local_458 == 0x2a) {
      secp256k1_gej_set_ge(r,&t);
    }
    else {
      iVar1 = 3;
      while (bVar12 = iVar1 != 0, iVar1 = iVar1 + -1, bVar12) {
        secp256k1_gej_double(r,r);
      }
      secp256k1_gej_add_ge(r,r,&t);
    }
    uVar7 = uVar3 >> 2 ^ 1;
    if (7 < uVar3) {
      pcVar8 = "test condition failed: (bits2) < (1U << ECMULT_CONST_GROUP_SIZE)";
      uVar4 = 0x106;
      goto LAB_001143ea;
    }
    t.x.n[4] = pre_a_lam[0].x.n[4];
    t.x.magnitude = pre_a_lam[0].x.magnitude;
    t.x.normalized = pre_a_lam[0].x.normalized;
    t.x.n[2] = pre_a_lam[0].x.n[2];
    t.x.n[3] = pre_a_lam[0].x.n[3];
    t.x.n[0] = pre_a_lam[0].x.n[0];
    t.x.n[1] = pre_a_lam[0].x.n[1];
    t.y.n[4] = pre_a_lam[0].y.n[4];
    t.y.magnitude = pre_a_lam[0].y.magnitude;
    t.y.normalized = pre_a_lam[0].y.normalized;
    t.y.n[2] = pre_a_lam[0].y.n[2];
    t.y.n[3] = pre_a_lam[0].y.n[3];
    t.y.n[0] = pre_a_lam[0].y.n[0];
    t.y.n[1] = pre_a_lam[0].y.n[1];
    psVar9 = local_468;
    for (uVar11 = 1; uVar11 != 4; uVar11 = uVar11 + 1) {
      uVar5 = (uint)(((uVar3 ^ -uVar7) & 3) == uVar11);
      secp256k1_fe_cmov(&t.x,(secp256k1_fe *)((long)psVar9 + -0x30),uVar5);
      secp256k1_fe_cmov(a_00,&psVar9->x,uVar5);
      psVar9 = (secp256k1_ge *)(((secp256k1_fe *)((long)psVar9 + 0x60))->n + 1);
    }
    t.infinity = 0;
    secp256k1_fe_negate_unchecked(&neg_y,a_00,1);
    secp256k1_fe_cmov(a_00,&neg_y,uVar7);
    secp256k1_gej_add_ge(r,r,&t);
    uVar11 = (ulong)((int)local_458 - 1);
  }
  pcVar8 = "test condition failed: (bits1) < (1U << ECMULT_CONST_GROUP_SIZE)";
  uVar4 = 0xfb;
LAB_001143ea:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/ecmult_const_impl.h"
          ,uVar4,pcVar8);
  abort();
code_r0x00114054:
  pcVar8 = "test condition failed: secp256k1_scalar_get_bits_limb32(&v2, i, 1) == 0";
  uVar4 = 0xda;
  goto LAB_001143ea;
}

Assistant:

static void secp256k1_ecmult_const(secp256k1_gej *r, const secp256k1_ge *a, const secp256k1_scalar *q) {
    /* The approach below combines the signed-digit logic from Mike Hamburg's
     * "Fast and compact elliptic-curve cryptography" (https://eprint.iacr.org/2012/309)
     * Section 3.3, with the GLV endomorphism.
     *
     * The idea there is to interpret the bits of a scalar as signs (1 = +, 0 = -), and compute a
     * point multiplication in that fashion. Let v be an n-bit non-negative integer (0 <= v < 2^n),
     * and v[i] its i'th bit (so v = sum(v[i] * 2^i, i=0..n-1)). Then define:
     *
     *   C_l(v, A) = sum((2*v[i] - 1) * 2^i*A, i=0..l-1)
     *
     * Then it holds that C_l(v, A) = sum((2*v[i] - 1) * 2^i*A, i=0..l-1)
     *                              = (2*sum(v[i] * 2^i, i=0..l-1) + 1 - 2^l) * A
     *                              = (2*v + 1 - 2^l) * A
     *
     * Thus, one can compute q*A as C_256((q + 2^256 - 1) / 2, A). This is the basis for the
     * paper's signed-digit multi-comb algorithm for multiplication using a precomputed table.
     *
     * It is appealing to try to combine this with the GLV optimization: the idea that a scalar
     * s can be written as s1 + lambda*s2, where lambda is a curve-specific constant such that
     * lambda*A is easy to compute, and where s1 and s2 are small. In particular we have the
     * secp256k1_scalar_split_lambda function which performs such a split with the resulting s1
     * and s2 in range (-2^128, 2^128) mod n. This does work, but is uninteresting:
     *
     *   To compute q*A:
     *   - Let s1, s2 = split_lambda(q)
     *   - Let R1 = C_256((s1 + 2^256 - 1) / 2, A)
     *   - Let R2 = C_256((s2 + 2^256 - 1) / 2, lambda*A)
     *   - Return R1 + R2
     *
     * The issue is that while s1 and s2 are small-range numbers, (s1 + 2^256 - 1) / 2 (mod n)
     * and (s2 + 2^256 - 1) / 2 (mod n) are not, undoing the benefit of the splitting.
     *
     * To make it work, we want to modify the input scalar q first, before splitting, and then only
     * add a 2^128 offset of the split results (so that they end up in the single 129-bit range
     * [0,2^129]). A slightly smaller offset would work due to the bounds on the split, but we pick
     * 2^128 for simplicity. Let s be the scalar fed to split_lambda, and f(q) the function to
     * compute it from q:
     *
     *   To compute q*A:
     *   - Compute s = f(q)
     *   - Let s1, s2 = split_lambda(s)
     *   - Let v1 = s1 + 2^128 (mod n)
     *   - Let v2 = s2 + 2^128 (mod n)
     *   - Let R1 = C_l(v1, A)
     *   - Let R2 = C_l(v2, lambda*A)
     *   - Return R1 + R2
     *
     * l will thus need to be at least 129, but we may overshoot by a few bits (see
     * further), so keep it as a variable.
     *
     * To solve for s, we reason:
     *     q*A  = R1 + R2
     * <=> q*A  = C_l(s1 + 2^128, A) + C_l(s2 + 2^128, lambda*A)
     * <=> q*A  = (2*(s1 + 2^128) + 1 - 2^l) * A + (2*(s2 + 2^128) + 1 - 2^l) * lambda*A
     * <=> q*A  = (2*(s1 + s2*lambda) + (2^129 + 1 - 2^l) * (1 + lambda)) * A
     * <=> q    = 2*(s1 + s2*lambda) + (2^129 + 1 - 2^l) * (1 + lambda) (mod n)
     * <=> q    = 2*s + (2^129 + 1 - 2^l) * (1 + lambda) (mod n)
     * <=> s    = (q + (2^l - 2^129 - 1) * (1 + lambda)) / 2 (mod n)
     * <=> f(q) = (q + K) / 2 (mod n)
     *            where K = (2^l - 2^129 - 1)*(1 + lambda) (mod n)
     *
     * We will process the computation of C_l(v1, A) and C_l(v2, lambda*A) in groups of
     * ECMULT_CONST_GROUP_SIZE, so we set l to the smallest multiple of ECMULT_CONST_GROUP_SIZE
     * that is not less than 129; this equals ECMULT_CONST_BITS.
     */

    /* The offset to add to s1 and s2 to make them non-negative. Equal to 2^128. */
    static const secp256k1_scalar S_OFFSET = SECP256K1_SCALAR_CONST(0, 0, 0, 1, 0, 0, 0, 0);
    secp256k1_scalar s, v1, v2;
    secp256k1_ge pre_a[ECMULT_CONST_TABLE_SIZE];
    secp256k1_ge pre_a_lam[ECMULT_CONST_TABLE_SIZE];
    secp256k1_fe global_z;
    int group, i;

    /* We're allowed to be non-constant time in the point, and the code below (in particular,
     * secp256k1_ecmult_const_odd_multiples_table_globalz) cannot deal with infinity in a
     * constant-time manner anyway. */
    if (secp256k1_ge_is_infinity(a)) {
        secp256k1_gej_set_infinity(r);
        return;
    }

    /* Compute v1 and v2. */
    secp256k1_scalar_add(&s, q, &secp256k1_ecmult_const_K);
    secp256k1_scalar_half(&s, &s);
    secp256k1_scalar_split_lambda(&v1, &v2, &s);
    secp256k1_scalar_add(&v1, &v1, &S_OFFSET);
    secp256k1_scalar_add(&v2, &v2, &S_OFFSET);

#ifdef VERIFY
    /* Verify that v1 and v2 are in range [0, 2^129-1]. */
    for (i = 129; i < 256; ++i) {
        VERIFY_CHECK(secp256k1_scalar_get_bits_limb32(&v1, i, 1) == 0);
        VERIFY_CHECK(secp256k1_scalar_get_bits_limb32(&v2, i, 1) == 0);
    }
#endif

    /* Calculate odd multiples of A and A*lambda.
     * All multiples are brought to the same Z 'denominator', which is stored
     * in global_z. Due to secp256k1' isomorphism we can do all operations pretending
     * that the Z coordinate was 1, use affine addition formulae, and correct
     * the Z coordinate of the result once at the end.
     */
    secp256k1_gej_set_ge(r, a);
    secp256k1_ecmult_const_odd_multiples_table_globalz(pre_a, &global_z, r);
    for (i = 0; i < ECMULT_CONST_TABLE_SIZE; i++) {
        secp256k1_ge_mul_lambda(&pre_a_lam[i], &pre_a[i]);
    }

    /* Next, we compute r = C_l(v1, A) + C_l(v2, lambda*A).
     *
     * We proceed in groups of ECMULT_CONST_GROUP_SIZE bits, operating on that many bits
     * at a time, from high in v1, v2 to low. Call these bits1 (from v1) and bits2 (from v2).
     *
     * Now note that ECMULT_CONST_TABLE_GET_GE(&t, pre_a, bits1) loads into t a point equal
     * to C_{ECMULT_CONST_GROUP_SIZE}(bits1, A), and analogously for pre_lam_a / bits2.
     * This means that all we need to do is add these looked up values together, multiplied
     * by 2^(ECMULT_GROUP_SIZE * group).
     */
    for (group = ECMULT_CONST_GROUPS - 1; group >= 0; --group) {
        /* Using the _var get_bits function is ok here, since it's only variable in offset and count, not in the scalar. */
        unsigned int bits1 = secp256k1_scalar_get_bits_var(&v1, group * ECMULT_CONST_GROUP_SIZE, ECMULT_CONST_GROUP_SIZE);
        unsigned int bits2 = secp256k1_scalar_get_bits_var(&v2, group * ECMULT_CONST_GROUP_SIZE, ECMULT_CONST_GROUP_SIZE);
        secp256k1_ge t;
        int j;

        ECMULT_CONST_TABLE_GET_GE(&t, pre_a, bits1);
        if (group == ECMULT_CONST_GROUPS - 1) {
            /* Directly set r in the first iteration. */
            secp256k1_gej_set_ge(r, &t);
        } else {
            /* Shift the result so far up. */
            for (j = 0; j < ECMULT_CONST_GROUP_SIZE; ++j) {
                secp256k1_gej_double(r, r);
            }
            secp256k1_gej_add_ge(r, r, &t);
        }
        ECMULT_CONST_TABLE_GET_GE(&t, pre_a_lam, bits2);
        secp256k1_gej_add_ge(r, r, &t);
    }

    /* Map the result back to the secp256k1 curve from the isomorphic curve. */
    secp256k1_fe_mul(&r->z, &r->z, &global_z);
}